

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiIO::ClearInputKeys(ImGuiIO *this)

{
  long lVar1;
  
  memset(this->KeysDown,0,0x200);
  lVar1 = -0x200;
  do {
    this->NavInputsDownDuration[lVar1] = -1.0;
    this->KeysDownDurationPrev[lVar1] = -1.0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0);
  this->KeyMods = 0;
  this->KeyModsPrev = 0;
  this->KeyCtrl = false;
  this->KeyShift = false;
  this->KeyAlt = false;
  this->KeySuper = false;
  lVar1 = -0x14;
  do {
    this->NavInputsDownDurationPrev[lVar1 + 0x14] = -1.0;
    this->NavInputsDownDurationPrev[lVar1] = -1.0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0);
  return;
}

Assistant:

void ImGuiIO::ClearInputKeys()
{
    memset(KeysDown, 0, sizeof(KeysDown));
    for (int n = 0; n < IM_ARRAYSIZE(KeysDownDuration); n++)
        KeysDownDuration[n] = KeysDownDurationPrev[n] = -1.0f;
    KeyCtrl = KeyShift = KeyAlt = KeySuper = false;
    KeyMods = KeyModsPrev = ImGuiKeyModFlags_None;
    for (int n = 0; n < IM_ARRAYSIZE(NavInputsDownDuration); n++)
        NavInputsDownDuration[n] = NavInputsDownDurationPrev[n] = -1.0f;
}